

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

void __thiscall QAction::setActionGroup(QAction *this,QActionGroup *group)

{
  QActionPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  QObject *pQVar3;
  
  this_00 = *(QActionPrivate **)&this->field_0x8;
  pDVar1 = (this_00->group).wp.d;
  if ((pDVar1 == (Data *)0x0) || ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0))
  {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this_00->group).wp.value;
  }
  if (pQVar3 != &group->super_QObject) {
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this_00->group);
    if (bVar2) {
      QActionGroup::removeAction((QActionGroup *)(this_00->group).wp.value,this);
    }
    QWeakPointer<QObject>::assign<QObject>(&(this_00->group).wp,&group->super_QObject);
    if (group != (QActionGroup *)0x0) {
      QActionGroup::addAction(group,this);
    }
    QActionPrivate::sendDataChanged(this_00);
    return;
  }
  return;
}

Assistant:

void QAction::setActionGroup(QActionGroup *group)
{
    Q_D(QAction);
    if (group == d->group)
        return;

    if (d->group)
        d->group->removeAction(this);
    d->group = group;
    if (group)
        group->addAction(this);
    d->sendDataChanged();
}